

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageMinus(StackInterpreter *this)

{
  StackMemory *pSVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  size_t sVar5;
  uint8_t *puVar6;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar7;
  Oop selector;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  
  pSVar1 = this->stack;
  puVar2 = (ulong *)(pSVar1->stackFrame).stackPointer;
  puVar3 = (ulong *)*puVar2;
  puVar4 = (ulong *)puVar2[1];
  uVar9 = (uint)puVar3;
  uVar8 = (uint)puVar4;
  if ((uVar9 & uVar8 & 1) != 0) {
    sVar5 = this->pc;
    this->pc = sVar5 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar5);
    (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
    aVar7 = (anon_union_8_4_0eb573b0_for_Oop_0)
            VMContext::signedInt64ObjectFor(this->context,((long)puVar4 >> 1) - ((long)puVar3 >> 1))
    ;
    goto LAB_001475fb;
  }
  if ((uVar9 & 7) == 2 && (uVar8 & 7) == 2) {
    sVar5 = this->pc;
    this->pc = sVar5 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar5);
    (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 1);
    puVar2[1] = (long)(int)(uVar8 - (uVar9 & 0xfffffff8));
    return;
  }
  if ((((((ulong)puVar4 & 1) == 0) && ((uVar8 & 6) != 4)) &&
      ((((ulong)puVar4 & 6) != 0 || ((uint)(*puVar4 >> 0x2a) != 0x22)))) ||
     (((((ulong)puVar3 & 1) == 0 && ((uVar9 & 6) != 4)) &&
      ((((ulong)puVar3 & 6) != 0 || ((uint)(*puVar3 >> 0x2a) != 0x22)))))) {
    selector = VMContext::getSpecialMessageSelector(this->context,Minus);
    sendSelectorArgumentCount(this,selector,1,false);
    return;
  }
  sVar5 = this->pc;
  this->pc = sVar5 + 1;
  this->nextOpcode =
       (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                              super_SequenceableCollection.super_Collection.super_Object.
                              super_ProtoObject.object_header_ + sVar5);
  (pSVar1->stackFrame).stackPointer = (uint8_t *)(puVar2 + 2);
  if (((ulong)puVar4 & 1) == 0) {
    uVar8 = uVar8 & 6;
    if (uVar8 != 4) {
      if ((((ulong)puVar4 & 6) != 0) || ((uint)(*puVar4 >> 0x2a) != 0x22)) goto LAB_00147622;
      if (uVar8 != 4) {
        if ((((ulong)puVar4 & 6) != 0) || ((*puVar4 & 0xfffffc0000000000) != 0x880000000000))
        goto LAB_00147641;
        if (uVar8 != 4) {
          dVar11 = (double)puVar4[1];
          goto LAB_00147575;
        }
      }
    }
    uVar10 = ((ulong)puVar4 >> 3) + 0x7000000000000000;
    dVar11 = (double)(uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f);
  }
  else {
    dVar11 = (double)((long)puVar4 >> 1);
  }
LAB_00147575:
  if (((ulong)puVar3 & 1) == 0) {
    uVar9 = uVar9 & 6;
    if (uVar9 != 4) {
      if ((((ulong)puVar3 & 6) != 0) || ((uint)(*puVar3 >> 0x2a) != 0x22)) {
LAB_00147622:
        __assert_fail("isFloatOrInt()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                      ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
      }
      if (uVar9 != 4) {
        if ((((ulong)puVar3 & 6) != 0) || ((*puVar3 & 0xfffffc0000000000) != 0x880000000000)) {
LAB_00147641:
          __assert_fail("isFloat()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                        ,0x216,"double Lodtalk::Oop::decodeFloat() const");
        }
        if (uVar9 != 4) {
          dVar12 = (double)puVar3[1];
          goto LAB_001475ef;
        }
      }
    }
    uVar10 = ((ulong)puVar3 >> 3) + 0x7000000000000000;
    dVar12 = (double)(uVar10 >> 1 | (ulong)((uVar10 & 1) != 0) << 0x3f);
  }
  else {
    dVar12 = (double)((long)puVar3 >> 1);
  }
LAB_001475ef:
  aVar7 = (anon_union_8_4_0eb573b0_for_Oop_0)
          VMContext::floatObjectFor(this->context,dVar11 - dVar12);
LAB_001475fb:
  puVar6 = (this->stack->stackFrame).stackPointer;
  (this->stack->stackFrame).stackPointer = puVar6 + -8;
  *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar6 + -8) = aVar7;
  return;
}

Assistant:

void interpretSpecialMessageMinus()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushIntegerObject(ia - ib);
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushOop(Oop::encodeCharacter(ca - cb));
        }
        else if(a.isFloatOrInt() && b.isFloatOrInt())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto fa = a.decodeFloatOrInt();
            auto fb = b.decodeFloatOrInt();
            pushFloatObject(fa - fb);
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::Minus, 1);
        }
    }